

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O3

REF_STATUS ref_fixture_hex_brick_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  uint uVar1;
  
  uVar1 = ref_fixture_hex_brick_args_grid(ref_grid_ptr,ref_mpi,0.0,1.0,0.0,1.0,0.0,1.0,4,4,4,0);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x4ef
           ,"ref_fixture_hex_brick_grid",(ulong)uVar1,"args");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_hex_brick_grid(REF_GRID *ref_grid_ptr,
                                              REF_MPI ref_mpi) {
  REF_INT l = 4, m = 4, n = 4;

  REF_DBL x0 = 0.0;
  REF_DBL x1 = 1.0;

  REF_DBL y0 = 0.0;
  REF_DBL y1 = 1.0;

  REF_DBL z0 = 0.0;
  REF_DBL z1 = 1.0;

  RSS(ref_fixture_hex_brick_args_grid(ref_grid_ptr, ref_mpi, x0, x1, y0, y1, z0,
                                      z1, l, m, n, 0),
      "args");
  return REF_SUCCESS;
}